

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnTableCopy(SharedValidator *this,Location *loc,Var *dst_var,Var *src_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Result RVar4;
  TableType src_table;
  TableType dst_table;
  TableType local_100;
  TableType local_e0;
  Var local_c0;
  Var local_78;
  
  this->expr_loc_ = loc;
  local_e0.element.enum_ = Any;
  local_e0.limits.initial = 0;
  local_e0.limits.max = 0;
  local_e0.limits.has_max = false;
  local_e0.limits.is_shared = false;
  local_100.element.enum_ = Any;
  local_100.limits.initial = 0;
  local_100.limits.max = 0;
  local_100.limits.has_max = false;
  local_100.limits.is_shared = false;
  Var::Var(&local_78,dst_var);
  RVar1 = CheckTableIndex(this,&local_78,&local_e0);
  Var::~Var(&local_78);
  Var::Var(&local_c0,src_var);
  RVar2 = CheckTableIndex(this,&local_c0,&local_100);
  Var::~Var(&local_c0);
  RVar3 = TypeChecker::OnTableCopy(&this->typechecker_);
  RVar4 = CheckType(this,loc,local_100.element,local_e0.element,"table.copy");
  RVar1.enum_._0_1_ =
       RVar4.enum_ == Error ||
       (RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error));
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnTableCopy(const Location& loc,
                                    Var dst_var,
                                    Var src_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  TableType dst_table;
  TableType src_table;
  result |= CheckTableIndex(dst_var, &dst_table);
  result |= CheckTableIndex(src_var, &src_table);
  result |= typechecker_.OnTableCopy();
  result |= CheckType(loc, src_table.element, dst_table.element, "table.copy");
  return result;
}